

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_rank_many(roaring_bitmap_t *bm,uint32_t *begin,uint32_t *end,uint64_t *ans)

{
  ushort uVar1;
  uint8_t uVar2;
  uint uVar3;
  int iVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  uint uVar7;
  uint64_t *puVar8;
  run_container_t *prVar9;
  ulong uVar10;
  uint64_t start_rank;
  int32_t n_runs;
  uint64_t uVar11;
  long lVar12;
  ushort uVar13;
  int iVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  
  if (begin != end && 0 < (bm->high_low_container).size) {
    start_rank = 0;
    iVar14 = 0;
    do {
      uVar3 = *begin;
      uVar7 = uVar3 >> 0x10;
      uVar16 = (uint)(bm->high_low_container).keys[iVar14];
      if (uVar16 < uVar7) {
        prVar9 = (run_container_t *)(bm->high_low_container).containers[iVar14];
        uVar2 = (bm->high_low_container).typecodes[iVar14];
        if (uVar2 == '\x04') {
          uVar2 = *(uint8_t *)&prVar9->runs;
          prVar9 = *(run_container_t **)prVar9;
        }
        if (uVar2 == '\x03') {
          uVar3 = croaring_hardware_support();
          if ((uVar3 & 2) == 0) {
            uVar3 = croaring_hardware_support();
            if ((uVar3 & 1) == 0) {
              iVar4 = prVar9->n_runs;
              lVar12 = (long)iVar4;
              if (0 < lVar12) {
                lVar15 = 0;
                do {
                  iVar4 = iVar4 + (uint)prVar9->runs[lVar15].length;
                  lVar15 = lVar15 + 1;
                } while (lVar12 != lVar15);
              }
            }
            else {
              iVar4 = _avx2_run_container_cardinality(prVar9);
            }
          }
          else {
            iVar4 = _avx512_run_container_cardinality(prVar9);
          }
        }
        else {
          iVar4 = prVar9->n_runs;
        }
        start_rank = start_rank + (long)iVar4;
        iVar14 = iVar14 + 1;
      }
      else if (uVar7 == uVar16) {
        prVar9 = (run_container_t *)(bm->high_low_container).containers[iVar14];
        uVar2 = (bm->high_low_container).typecodes[iVar14];
        if (uVar2 == '\x04') {
          uVar2 = *(uint8_t *)&prVar9->runs;
          prVar9 = *(run_container_t **)prVar9;
        }
        if (uVar2 == '\x03') {
          uVar3 = run_container_rank_many(prVar9,start_rank,begin,end,ans);
        }
        else if (uVar2 == '\x02') {
          puVar6 = end;
          if (begin != end) {
            uVar17 = 0;
            puVar5 = begin;
            puVar8 = ans;
            do {
              puVar6 = puVar5;
              if (0xffff < (*puVar5 ^ uVar3)) break;
              iVar4 = prVar9->n_runs - (int)uVar17;
              if (iVar4 < 1) {
                uVar10 = 0;
              }
              else {
                iVar4 = iVar4 + -1;
                uVar10 = 0;
                do {
                  uVar16 = iVar4 + (int)uVar10;
                  uVar7 = uVar16 >> 1;
                  uVar1 = *(ushort *)
                           ((long)&prVar9->runs->value + (ulong)(uVar16 & 0xfffffffe) + uVar17 * 2);
                  uVar13 = (ushort)*puVar5;
                  if (uVar1 < uVar13) {
                    uVar10 = (ulong)(uVar7 + 1);
                  }
                  else {
                    if (uVar1 <= uVar13) {
                      uVar11 = uVar17 + start_rank + (ulong)uVar7 + 1;
                      uVar17 = (ulong)(uVar7 + 1);
                      goto LAB_0012028a;
                    }
                    iVar4 = uVar7 - 1;
                  }
                } while ((int)uVar10 <= iVar4);
              }
              uVar11 = uVar17 + start_rank + uVar10;
LAB_0012028a:
              *puVar8 = uVar11;
              puVar8 = puVar8 + 1;
              puVar5 = puVar5 + 1;
              puVar6 = end;
            } while (puVar5 != end);
          }
          uVar3 = (uint)((ulong)((long)puVar6 - (long)begin) >> 2);
        }
        else {
          uVar3 = bitset_container_rank_many((bitset_container_t *)prVar9,start_rank,begin,end,ans);
        }
        begin = begin + uVar3;
        ans = ans + uVar3;
      }
      else {
        *ans = start_rank;
        ans = ans + 1;
        begin = begin + 1;
      }
    } while ((iVar14 < (bm->high_low_container).size) && (begin != end));
  }
  return;
}

Assistant:

void roaring_bitmap_rank_many(const roaring_bitmap_t *bm, const uint32_t *begin,
                              const uint32_t *end, uint64_t *ans) {
    uint64_t size = 0;

    int i = 0;
    const uint32_t *iter = begin;
    while (i < bm->high_low_container.size && iter != end) {
        uint32_t x = *iter;
        uint32_t xhigh = x >> 16;
        uint32_t key = bm->high_low_container.keys[i];
        if (xhigh > key) {
            size +=
                container_get_cardinality(bm->high_low_container.containers[i],
                                          bm->high_low_container.typecodes[i]);
            i++;
        } else if (xhigh == key) {
            uint32_t consumed = container_rank_many(
                bm->high_low_container.containers[i],
                bm->high_low_container.typecodes[i], size, iter, end, ans);
            iter += consumed;
            ans += consumed;
        } else {
            *(ans++) = size;
            iter++;
        }
    }
}